

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int emit_esni_extension(st_ptls_esni_secret_t *esni,ptls_buffer_t *buf,ptls_iovec_t esni_keys,
                       char *server_name,size_t key_share_ch_off,size_t key_share_ch_len)

{
  long lVar1;
  long lVar2;
  int iVar3;
  size_t delta;
  size_t body_size_1;
  size_t bytes_to_pad;
  size_t start_off;
  size_t body_start_1;
  size_t capacity_1;
  size_t body_size;
  size_t body_start;
  size_t capacity;
  uint16_t _v;
  ptls_aead_context_t *ppStack_40;
  int ret;
  ptls_aead_context_t *aead;
  size_t key_share_ch_off_local;
  char *server_name_local;
  ptls_buffer_t *buf_local;
  st_ptls_esni_secret_t *esni_local;
  ptls_iovec_t esni_keys_local;
  
  esni_keys_local.base = (uint8_t *)esni_keys.len;
  esni_local = (st_ptls_esni_secret_t *)esni_keys.base;
  ppStack_40 = (ptls_aead_context_t *)0x0;
  aead = (ptls_aead_context_t *)key_share_ch_off;
  key_share_ch_off_local = (size_t)server_name;
  server_name_local = (char *)buf;
  buf_local = (ptls_buffer_t *)esni;
  capacity._4_4_ =
       create_esni_aead(&stack0xffffffffffffffc0,1,(esni->field_3).client.cipher,esni->secret,
                        esni->esni_contents_hash);
  if (capacity._4_4_ == 0) {
    capacity._2_2_ = *(undefined2 *)buf_local[3].capacity;
    capacity._0_1_ = (undefined1)((ushort)capacity._2_2_ >> 8);
    capacity._1_1_ = (undefined1)capacity._2_2_;
    capacity._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)server_name_local,&capacity,2);
    if ((capacity._4_4_ == 0) &&
       (capacity._4_4_ =
             push_key_share_entry
                       ((ptls_buffer_t *)server_name_local,*(uint16_t *)buf_local[3].base,
                        *(ptls_iovec_t *)&buf_local[3].off), capacity._4_4_ == 0)) {
      body_start = 2;
      capacity._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)server_name_local,"",2);
      if (capacity._4_4_ == 0) {
        lVar1 = *(long *)(server_name_local + 0x10);
        capacity._4_4_ =
             ptls_buffer__do_pushv
                       ((ptls_buffer_t *)server_name_local,buf_local + 4,
                        *(size_t *)(*(long *)(buf_local[3].capacity + 0x10) + 8));
        if (capacity._4_4_ == 0) {
          lVar2 = *(long *)(server_name_local + 0x10);
          for (; body_start != 0; body_start = body_start - 1) {
            *(char *)(*(long *)server_name_local + (lVar1 - body_start)) =
                 (char)((ulong)(lVar2 - lVar1) >> (((char)body_start + -1) * '\b' & 0x3fU));
          }
          body_start_1 = 2;
          capacity._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)server_name_local,"",2);
          if (capacity._4_4_ == 0) {
            lVar1 = *(long *)(server_name_local + 0x10);
            lVar2 = *(long *)(server_name_local + 0x10);
            capacity._4_4_ =
                 ptls_buffer__do_pushv((ptls_buffer_t *)server_name_local,&buf_local->off,0x10);
            if ((capacity._4_4_ == 0) &&
               (capacity._4_4_ =
                     emit_server_name_extension
                               ((ptls_buffer_t *)server_name_local,(char *)key_share_ch_off_local),
               capacity._4_4_ == 0)) {
              iVar3 = 0;
              if ((ulong)(*(long *)(server_name_local + 0x10) - lVar2) <
                  (ulong)(long)(int)(*(ushort *)&buf_local[6].base + 0x10)) {
                delta = (long)(int)(*(ushort *)&buf_local[6].base + 0x10) -
                        (*(long *)(server_name_local + 0x10) - lVar2);
                capacity._4_4_ = ptls_buffer_reserve((ptls_buffer_t *)server_name_local,delta);
                if (capacity._4_4_ != 0) goto LAB_00123814;
                memset((void *)(*(long *)server_name_local + *(long *)(server_name_local + 0x10)),0,
                       delta);
                *(size_t *)(server_name_local + 0x10) = delta + *(long *)(server_name_local + 0x10);
                iVar3 = capacity._4_4_;
              }
              capacity._4_4_ = iVar3;
              capacity._4_4_ =
                   ptls_buffer_reserve((ptls_buffer_t *)server_name_local,ppStack_40->algo->tag_size
                                      );
              if (capacity._4_4_ == 0) {
                ptls_aead_encrypt(ppStack_40,(void *)(*(long *)server_name_local + lVar2),
                                  (void *)(*(long *)server_name_local + lVar2),
                                  *(long *)(server_name_local + 0x10) - lVar2,0,
                                  aead->static_iv + *(long *)server_name_local + -8,key_share_ch_len
                                 );
                *(size_t *)(server_name_local + 0x10) =
                     ppStack_40->algo->tag_size + *(long *)(server_name_local + 0x10);
                lVar2 = *(long *)(server_name_local + 0x10);
                for (; body_start_1 != 0; body_start_1 = body_start_1 - 1) {
                  *(char *)(*(long *)server_name_local + (lVar1 - body_start_1)) =
                       (char)((ulong)(lVar2 - lVar1) >> (((char)body_start_1 + -1) * '\b' & 0x3fU));
                }
                capacity._4_4_ = 0;
              }
            }
          }
        }
      }
    }
  }
LAB_00123814:
  if (ppStack_40 != (ptls_aead_context_t *)0x0) {
    ptls_aead_free(ppStack_40);
  }
  return capacity._4_4_;
}

Assistant:

static int emit_esni_extension(struct st_ptls_esni_secret_t *esni, ptls_buffer_t *buf, ptls_iovec_t esni_keys,
                               const char *server_name, size_t key_share_ch_off, size_t key_share_ch_len)
{
    ptls_aead_context_t *aead = NULL;
    int ret;

    if ((ret = create_esni_aead(&aead, 1, esni->client.cipher, esni->secret, esni->esni_contents_hash)) != 0)
        goto Exit;

    /* cipher-suite id */
    ptls_buffer_push16(buf, esni->client.cipher->id);
    /* key-share */
    if ((ret = push_key_share_entry(buf, esni->client.key_share->id, esni->client.pubkey)) != 0)
        goto Exit;
    /* record-digest */
    ptls_buffer_push_block(buf, 2, { ptls_buffer_pushv(buf, esni->client.record_digest, esni->client.cipher->hash->digest_size); });
    /* encrypted sni */
    ptls_buffer_push_block(buf, 2, {
        size_t start_off = buf->off;
        /* nonce */
        ptls_buffer_pushv(buf, esni->nonce, PTLS_ESNI_NONCE_SIZE);
        /* emit server-name extension */
        if ((ret = emit_server_name_extension(buf, server_name)) != 0)
            goto Exit;
        /* pad */
        if (buf->off - start_off < (size_t)(esni->client.padded_length + PTLS_ESNI_NONCE_SIZE)) {
            size_t bytes_to_pad = esni->client.padded_length + PTLS_ESNI_NONCE_SIZE - (buf->off - start_off);
            if ((ret = ptls_buffer_reserve(buf, bytes_to_pad)) != 0)
                goto Exit;
            memset(buf->base + buf->off, 0, bytes_to_pad);
            buf->off += bytes_to_pad;
        }
        /* encrypt */
        if ((ret = ptls_buffer_reserve(buf, aead->algo->tag_size)) != 0)
            goto Exit;
        ptls_aead_encrypt(aead, buf->base + start_off, buf->base + start_off, buf->off - start_off, 0, buf->base + key_share_ch_off,
                          key_share_ch_len);
        buf->off += aead->algo->tag_size;
    });

    ret = 0;
Exit:
    if (aead != NULL)
        ptls_aead_free(aead);
    return ret;
}